

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O3

void Nwk_ManDeriveMinCut(Gia_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  ulong uVar2;
  Vec_Int_t *__ptr;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Nwk_Man_t *pNtk;
  Vec_Ptr_t *__ptr_00;
  Vec_Int_t *vLeaves;
  long lVar8;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  int *pBeg1;
  int *piVar11;
  ulong uVar12;
  uint uVar13;
  int *piVar14;
  int *pBeg2;
  long lVar15;
  int *piVar16;
  Vec_Int_t *vPPis;
  Vec_Int_t *vMapInv;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  long local_40;
  Vec_Int_t *local_38;
  
  Gia_ManGlaCollect(p,p->vGateClasses,(Vec_Int_t **)0x0,&local_58,(Vec_Int_t **)0x0,
                    (Vec_Int_t **)0x0);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  Gia_ManIncrementTravId(p);
  if (0 < local_58->nSize) {
    lVar15 = 0;
    do {
      iVar3 = local_58->pArray[lVar15];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_008e7f42;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Nwk_ManColleacReached_rec(p,p->pObjs + iVar3,pVVar5,pVVar7);
      lVar15 = lVar15 + 1;
    } while (lVar15 < local_58->nSize);
  }
  local_50 = pVVar5;
  local_38 = pVVar7;
  pNtk = Nwk_ManCreateFromGia(p,local_58,pVVar5,pVVar7,&local_48);
  iVar3 = Nwk_ManPiNum(pNtk);
  iVar4 = Nwk_ManPoNum(pNtk);
  if (iVar3 != iVar4) {
    __assert_fail("Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                  ,0xed,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
  }
  iVar3 = Nwk_ManPiNum(pNtk);
  __ptr_00 = Nwk_ManRetimeCutBackward(pNtk,iVar3,fVerbose);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  piVar6 = (int *)malloc(400);
  vLeaves->pArray = piVar6;
  Gia_ManIncrementTravId(p);
  pVVar5 = local_48;
  uVar10 = (ulong)(uint)__ptr_00->nSize;
  if (0 < __ptr_00->nSize) {
    lVar15 = 0;
    do {
      iVar3 = *(int *)((long)__ptr_00->pArray[lVar15] + 0x24);
      if (((long)iVar3 < 0) || (pVVar5->nSize <= iVar3)) goto LAB_008e7f61;
      iVar3 = pVVar5->pArray[iVar3];
      lVar8 = (long)iVar3;
      if ((lVar8 < 0) || (p->nObjs <= iVar3)) {
LAB_008e7f42:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((~*(ulong *)(p->pObjs + lVar8) & 0x1fffffff1fffffff) != 0) {
        Nwk_ManColleacReached_rec(p,p->pObjs + lVar8,pVVar7,vLeaves);
        uVar10 = (ulong)(uint)__ptr_00->nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar10);
  }
  pVVar5 = local_50;
  if (fVerbose != 0) {
    printf("Min-cut: %d -> %d.  Nodes %d -> %d.  ",(ulong)(local_58->nSize + 1),uVar10,
           (ulong)(uint)local_50->nSize,(ulong)(uint)pVVar7->nSize);
  }
  if (local_58->pArray != (int *)0x0) {
    free(local_58->pArray);
  }
  free(local_58);
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  Nwk_ManFree(pNtk);
  qsort(pVVar5->pArray,(long)pVVar5->nSize,4,Vec_IntSortCompare1);
  qsort(pVVar7->pArray,(long)pVVar7->nSize,4,Vec_IntSortCompare1);
  iVar3 = pVVar5->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  local_40 = (long)iVar3;
  if (iVar4 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_01->pArray = piVar6;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 100;
  p_02->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_02->pArray = piVar6;
  piVar11 = pVVar5->pArray;
  piVar16 = pVVar7->pArray;
  piVar14 = piVar11 + local_40;
  piVar6 = piVar16 + pVVar7->nSize;
  if (0 < pVVar7->nSize && 0 < (int)local_40) {
    do {
      iVar3 = *piVar11;
      iVar4 = *piVar16;
      if (iVar3 == iVar4) {
        piVar11 = piVar11 + 1;
        Vec_IntPush(p_00,iVar3);
        piVar16 = piVar16 + 1;
      }
      else {
        if (iVar3 < iVar4) {
          piVar11 = piVar11 + 1;
          pVVar5 = p_01;
          iVar4 = iVar3;
        }
        else {
          piVar16 = piVar16 + 1;
          pVVar5 = p_02;
        }
        Vec_IntPush(pVVar5,iVar4);
      }
    } while ((piVar11 < piVar14) && (piVar16 < piVar6));
  }
  for (; pVVar5 = local_50, __ptr = local_38, piVar11 < piVar14; piVar11 = piVar11 + 1) {
    Vec_IntPush(p_01,*piVar11);
  }
  for (; local_50 = pVVar5, local_38 = __ptr, piVar16 < piVar6; piVar16 = piVar16 + 1) {
    Vec_IntPush(p_02,*piVar16);
    pVVar5 = local_50;
    __ptr = local_38;
  }
  uVar13 = p_01->nSize;
  if (fVerbose != 0) {
    printf("Common = %d.  Diff0 = %d. Diff1 = %d.\n",(ulong)(uint)p_00->nSize,(ulong)uVar13,
           (ulong)(uint)p_02->nSize);
  }
  if (0 < (int)uVar13) {
    piVar6 = p_01->pArray;
    pVVar1 = p->vGateClasses;
    uVar10 = 0;
    do {
      iVar3 = piVar6[uVar10];
      if (((long)iVar3 < 0) || (pVVar1->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar1->pArray[iVar3] = 1;
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  if ((0 < p->nObjs) && (pGVar9 = p->pObjs, pGVar9 != (Gia_Obj_t *)0x0)) {
    uVar13 = p->vGateClasses->nSize;
    uVar12 = 0;
    uVar10 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar10 = uVar12;
    }
    do {
      if (uVar10 == uVar12) {
LAB_008e7f61:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((((p->vGateClasses->pArray[uVar12] != 0) &&
           (uVar2 = *(ulong *)pGVar9, (~uVar2 & 0x1fffffff1fffffff) != 0)) &&
          ((uVar13 = (uint)uVar2, (~uVar13 & 0x9fffffff) != 0 ||
           ((int)((uint)(uVar2 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)))) &&
         (((int)uVar13 < 0 || ((uVar13 & 0x1fffffff) == 0x1fffffff)))) {
        __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkAig.c"
                      ,0x121,"void Nwk_ManDeriveMinCut(Gia_Man_t *, int)");
      }
      uVar12 = uVar12 + 1;
      pGVar9 = pGVar9 + 1;
    } while ((uint)p->nObjs != uVar12);
  }
  return;
}

Assistant:

void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t * pNode;
    Vec_Ptr_t * vMinCut;
    Vec_Int_t * vPPis, * vNodes, * vLeaves, * vNodes2, * vLeaves2, * vMapInv;
    Vec_Int_t * vCommon, * vDiff0, * vDiff1;
    Gia_Obj_t * pObj;
    int i, iObjId;
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, NULL, &vPPis, NULL, NULL );
    // collect nodes rechable from PPIs
    vNodes = Vec_IntAlloc( 100 );
    vLeaves = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        Nwk_ManColleacReached_rec( p, pObj, vNodes, vLeaves );
    // derive the new network
    pNtk = Nwk_ManCreateFromGia( p, vPPis, vNodes, vLeaves, &vMapInv );
    assert( Nwk_ManPiNum(pNtk) == Nwk_ManPoNum(pNtk) );
    // create min-cut
    vMinCut = Nwk_ManRetimeCutBackward( pNtk, Nwk_ManPiNum(pNtk), fVerbose );
    // copy from the GIA back
//    Aig_ManForEachObj( p, pObj, i )
//        ((Nwk_Obj_t *)pObj->pData)->pCopy = pObj;
    // mark min-cut nodes
    vNodes2 = Vec_IntAlloc( 100 );
    vLeaves2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vMinCut, pNode, i )
    {
        pObj = Gia_ManObj( p, Vec_IntEntry(vMapInv, Nwk_ObjId(pNode)) );
        if ( Gia_ObjIsConst0(pObj) )
            continue;
        Nwk_ManColleacReached_rec( p, pObj, vNodes2, vLeaves2 );
    }
    if ( fVerbose )
        printf( "Min-cut: %d -> %d.  Nodes %d -> %d.  ", Vec_IntSize(vPPis)+1, Vec_PtrSize(vMinCut), Vec_IntSize(vNodes), Vec_IntSize(vNodes2) );
    Vec_IntFree( vPPis );
    Vec_PtrFree( vMinCut );
    Vec_IntFree( vMapInv );
    Nwk_ManFree( pNtk );

    // sort the results
    Vec_IntSort( vNodes, 0 );
    Vec_IntSort( vNodes2, 0 );
    vCommon = Vec_IntAlloc( Vec_IntSize(vNodes) );
    vDiff0 = Vec_IntAlloc( 100 );
    vDiff1 = Vec_IntAlloc( 100 );
    Vec_IntTwoSplit( vNodes, vNodes2, vCommon, vDiff0, vDiff1 );
    if ( fVerbose )
        printf( "Common = %d.  Diff0 = %d. Diff1 = %d.\n", Vec_IntSize(vCommon), Vec_IntSize(vDiff0), Vec_IntSize(vDiff1) );

    // fill in
    Vec_IntForEachEntry( vDiff0, iObjId, i )
        Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );

    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves2 );
    Vec_IntFree( vNodes2 );

    Vec_IntFree( vCommon );
    Vec_IntFree( vDiff0 );
    Vec_IntFree( vDiff1 );

    // check abstraction
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Vec_IntEntry( p->vGateClasses, i ) == 0 )
            continue;
        assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) );
    }
}